

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O2

bool __thiscall
gss::innards::HomomorphismSearcher::propagate_occur_less_thans
          (HomomorphismSearcher *this,
          optional<gss::innards::HomomorphismAssignment> *current_assignment,
          HomomorphismAssignments *assignments,Domains *new_domains)

{
  uint *puVar1;
  pointer pHVar2;
  pointer pHVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  pointer pHVar7;
  pointer ppVar8;
  type *a;
  pointer pHVar9;
  HomomorphismDomain *d_2;
  type *a_3;
  pointer ppVar10;
  byte bVar11;
  type *a_2;
  Domains *__range3;
  vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
  *__range1;
  vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
  occurs;
  anon_class_24_3_9ba074a0 build_occurs;
  vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
  local_68;
  pointer local_50;
  anon_class_24_3_9ba074a0 local_48;
  
  std::
  vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
  ::vector(&local_68,(ulong)this->model->target_size,(allocator_type *)&local_48);
  ppVar10 = (this->model->target_occur_less_thans_in_convenient_order).
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_48.occurs = &local_68;
  local_48.this = this;
  local_48.new_domains = new_domains;
  for (ppVar8 = (this->model->target_occur_less_thans_in_convenient_order).
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar10; ppVar8 = ppVar8 + 1) {
    propagate_occur_less_thans::anon_class_24_3_9ba074a0::operator()(&local_48,ppVar8->first);
    propagate_occur_less_thans::anon_class_24_3_9ba074a0::operator()(&local_48,ppVar8->second);
  }
  pHVar2 = (assignments->values).
           super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pHVar7 = (assignments->values).
                super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                ._M_impl.super__Vector_impl_data._M_start; pHVar7 != pHVar2; pHVar7 = pHVar7 + 1) {
    uVar6 = (pHVar7->assignment).target_vertex;
    if (local_68.
        super__Vector_base<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar6].
        super__Optional_base<gss::innards::SVOBitset,_false,_false>._M_payload.
        super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
        super__Optional_payload_base<gss::innards::SVOBitset>._M_engaged == true) {
      SVOBitset::set((SVOBitset *)
                     (local_68.
                      super__Vector_base<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar6),
                     (pHVar7->assignment).pattern_vertex);
    }
  }
  ppVar10 = (this->model->target_occur_less_thans_in_convenient_order).
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar8 = (this->model->target_occur_less_thans_in_convenient_order).
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar10; ppVar8 = ppVar8 + 1) {
    uVar6 = SVOBitset::find_first
                      ((SVOBitset *)
                       (local_68.
                        super__Vector_base<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + ppVar8->first));
    if (uVar6 == 0xffffffff) {
      SVOBitset::reset((SVOBitset *)
                       (local_68.
                        super__Vector_base<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + ppVar8->second));
      pHVar3 = (new_domains->
               super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pHVar9 = (new_domains->
                    super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                    )._M_impl.super__Vector_impl_data._M_start; pHVar9 != pHVar3;
          pHVar9 = pHVar9 + 1) {
        bVar4 = SVOBitset::test(&pHVar9->values,ppVar8->second);
        if (bVar4) {
          SVOBitset::reset(&pHVar9->values,ppVar8->second);
          puVar1 = &pHVar9->count;
          *puVar1 = *puVar1 - 1;
          if (*puVar1 == 0) goto LAB_00131281;
        }
      }
    }
    else {
      pHVar3 = (new_domains->
               super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pHVar9 = (new_domains->
                    super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                    )._M_impl.super__Vector_impl_data._M_start; pHVar9 != pHVar3;
          pHVar9 = pHVar9 + 1) {
        if (pHVar9->v < uVar6) {
          bVar4 = SVOBitset::test(&pHVar9->values,ppVar8->second);
          if (bVar4) {
            SVOBitset::reset((SVOBitset *)
                             (local_68.
                              super__Vector_base<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + ppVar8->second),pHVar9->v)
            ;
            SVOBitset::reset(&pHVar9->values,ppVar8->second);
            puVar1 = &pHVar9->count;
            *puVar1 = *puVar1 - 1;
            if (*puVar1 == 0) goto LAB_00131281;
          }
        }
      }
    }
  }
  if ((current_assignment->super__Optional_base<gss::innards::HomomorphismAssignment,_true,_true>).
      _M_payload.super__Optional_payload_base<gss::innards::HomomorphismAssignment>._M_engaged ==
      true) {
    ppVar8 = (this->model->target_occur_less_thans_in_convenient_order).
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_50 = ppVar8;
    for (ppVar10 = (this->model->target_occur_less_thans_in_convenient_order).
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; bVar4 = ppVar10 == ppVar8, !bVar4;
        ppVar10 = ppVar10 + 1) {
      if (ppVar10->second ==
          (current_assignment->
          super__Optional_base<gss::innards::HomomorphismAssignment,_true,_true>)._M_payload.
          super__Optional_payload_base<gss::innards::HomomorphismAssignment>._M_payload._M_value.
          target_vertex) {
        bVar11 = 0;
        pHVar3 = (new_domains->
                 super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pHVar9 = (new_domains->
                      super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                      )._M_impl.super__Vector_impl_data._M_start; pHVar9 != pHVar3;
            pHVar9 = pHVar9 + 1) {
          uVar6 = (current_assignment->
                  super__Optional_base<gss::innards::HomomorphismAssignment,_true,_true>)._M_payload
                  .super__Optional_payload_base<gss::innards::HomomorphismAssignment>._M_payload.
                  _M_value.pattern_vertex;
          if (pHVar9->v < uVar6) {
            bVar5 = SVOBitset::test(&pHVar9->values,ppVar10->first);
            bVar11 = bVar11 | bVar5;
          }
          else if (uVar6 < pHVar9->v) {
            bVar5 = SVOBitset::test(&pHVar9->values,ppVar10->first);
            if (bVar5) {
              SVOBitset::reset((SVOBitset *)
                               (local_68.
                                super__Vector_base<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + ppVar10->first),
                               pHVar9->v);
              SVOBitset::reset(&pHVar9->values,ppVar10->first);
              puVar1 = &pHVar9->count;
              *puVar1 = *puVar1 - 1;
              if (*puVar1 == 0) goto LAB_00131281;
            }
          }
        }
        for (pHVar7 = (assignments->values).
                      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pHVar7 != (assignments->values).
                      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pHVar7 = pHVar7 + 1) {
          bVar11 = bVar11 | (ppVar10->first == (pHVar7->assignment).target_vertex &&
                            (pHVar7->assignment).pattern_vertex <
                            (current_assignment->
                            super__Optional_base<gss::innards::HomomorphismAssignment,_true,_true>).
                            _M_payload.
                            super__Optional_payload_base<gss::innards::HomomorphismAssignment>.
                            _M_payload._M_value.pattern_vertex);
        }
        ppVar8 = local_50;
        if (bVar11 == 0) goto LAB_00131283;
      }
    }
  }
  bVar4 = true;
LAB_00131283:
  std::
  vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
  ::~vector(&local_68);
  return bVar4;
LAB_00131281:
  bVar4 = false;
  goto LAB_00131283;
}

Assistant:

auto HomomorphismSearcher::propagate_occur_less_thans(
    const optional<HomomorphismAssignment> & current_assignment,
    const HomomorphismAssignments & assignments,
    Domains & new_domains) -> bool
{
    vector<optional<SVOBitset>> occurs(model.target_size);

    auto build_occurs = [&](int p) -> void {
        if (occurs[p])
            return;

        occurs[p] = make_optional<SVOBitset>(model.pattern_size, 0);
        for (auto & d : new_domains)
            if (d.values.test(p))
                occurs[p]->set(d.v);
    };

    for (auto & [a, b] : model.target_occur_less_thans_in_convenient_order) {
        build_occurs(a);
        build_occurs(b);
    }

    for (auto & a : assignments.values)
        if (occurs[a.assignment.target_vertex])
            occurs[a.assignment.target_vertex]->set(a.assignment.pattern_vertex);

    // propagate lower bounds
    for (auto & [a, b] : model.target_occur_less_thans_in_convenient_order) {
        auto first_a = occurs[a]->find_first();
        if (first_a == SVOBitset::npos) {
            // no occurrence of value a, value b cannot be used either
            occurs[b]->reset();
            for (auto & d : new_domains)
                if (d.values.test(b)) {
                    d.values.reset(b);
                    if (0 == --d.count)
                        return false;
                }
        }
        else {
            // value a first occurs in variable x, value b cannot be used in a variable lower than x
            for (auto & d : new_domains) {
                if (d.v < first_a && d.values.test(b)) {
                    occurs[b]->reset(d.v);
                    d.values.reset(b);
                    if (0 == --d.count)
                        return false;
                }
            }
        }
    }

    // propagate other way: if value b must occur (because it has been assigned) then
    // value a must go before
    if (current_assignment) {
        for (auto & [a, b] : model.target_occur_less_thans_in_convenient_order) {
            if (b != current_assignment->target_vertex)
                continue;

            bool saw_an_a = false;
            for (auto & d : new_domains) {
                if (d.v < current_assignment->pattern_vertex) {
                    // it's before
                    if (d.values.test(a))
                        saw_an_a = true;
                }
                else if (d.v > current_assignment->pattern_vertex) {
                    // comes after, can't use a
                    if (d.values.test(a)) {
                        occurs[a]->reset(d.v);
                        d.values.reset(a);
                        if (0 == --d.count)
                            return false;
                    }
                }
            }

            for (auto & d : assignments.values)
                if (d.assignment.pattern_vertex < current_assignment->pattern_vertex && a == d.assignment.target_vertex)
                    saw_an_a = true;

            if (! saw_an_a)
                return false;
        }
    }

    return true;
}